

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newLhs,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldLhs)

{
  fpclass_type fVar1;
  int32_t iVar2;
  Status *pSVar3;
  pointer pnVar4;
  Real RVar5;
  bool bVar6;
  int iVar7;
  Status SVar8;
  int iVar9;
  fpclass_type fVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  undefined8 *puVar13;
  long lVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  pointer pnVar17;
  pointer pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  pointer pnVar20;
  byte bVar21;
  long in_FS_OFFSET;
  byte bVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<200U,_int,_void> local_648;
  double local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined5 uStack_550;
  undefined3 uStack_54b;
  int iStack_548;
  byte bStack_544;
  undefined8 local_540;
  cpp_dec_float<200U,_int,_void> local_538;
  cpp_dec_float<200U,_int,_void> local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  cpp_dec_float<200U,_int,_void> local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  pSVar3 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar4 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = (uint *)(pnVar4 + i);
  pcVar12 = &local_4b8;
  for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
    (pcVar12->data)._M_elems[0] = *puVar15;
    puVar15 = puVar15 + 1;
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((pcVar12->data)._M_elems + 1);
  }
  iVar7 = pnVar4[i].m_backend.exp;
  bVar6 = pnVar4[i].m_backend.neg;
  fVar1 = pnVar4[i].m_backend.fpclass;
  iVar2 = pnVar4[i].m_backend.prec_elem;
  local_540._0_4_ = cpp_dec_float_finite;
  local_540._4_4_ = 0x1c;
  local_5b8 = 0;
  uStack_5b0 = 0;
  local_5a8 = 0;
  uStack_5a0 = 0;
  local_598 = 0;
  uStack_590 = 0;
  local_588 = 0;
  uStack_580 = 0;
  local_578 = 0;
  uStack_570 = 0;
  local_568 = 0;
  uStack_560 = 0;
  local_558 = 0;
  uStack_550 = 0;
  uStack_54b = 0;
  iStack_548 = 0;
  bStack_544 = 0;
  local_4b8.exp = iVar7;
  local_4b8.neg = bVar6;
  local_4b8.fpclass = fVar1;
  local_4b8.prec_elem = iVar2;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_5b8,0.0);
  switch(pSVar3[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if ((this->theRep == ROW) && ((this->theShift).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_648.fpclass = cpp_dec_float_finite;
      local_648.prec_elem = 0x1c;
      local_648.data._M_elems[0] = 0;
      local_648.data._M_elems[1] = 0;
      local_648.data._M_elems[2] = 0;
      local_648.data._M_elems[3] = 0;
      local_648.data._M_elems[4] = 0;
      local_648.data._M_elems[5] = 0;
      local_648.data._M_elems[6] = 0;
      local_648.data._M_elems[7] = 0;
      local_648.data._M_elems[8] = 0;
      local_648.data._M_elems[9] = 0;
      local_648.data._M_elems[10] = 0;
      local_648.data._M_elems[0xb] = 0;
      local_648.data._M_elems[0xc] = 0;
      local_648.data._M_elems[0xd] = 0;
      local_648.data._M_elems[0xe] = 0;
      local_648.data._M_elems[0xf] = 0;
      local_648.data._M_elems[0x10] = 0;
      local_648.data._M_elems[0x11] = 0;
      local_648.data._M_elems[0x12] = 0;
      local_648.data._M_elems[0x13] = 0;
      local_648.data._M_elems[0x14] = 0;
      local_648.data._M_elems[0x15] = 0;
      local_648.data._M_elems[0x16] = 0;
      local_648.data._M_elems[0x17] = 0;
      local_648.data._M_elems[0x18] = 0;
      local_648.data._M_elems[0x19] = 0;
      local_648.data._M_elems._104_5_ = 0;
      local_648.data._M_elems[0x1b]._1_3_ = 0;
      local_648.exp = 0;
      local_648.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_648,0.0);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->theShift).m_backend,&local_648);
      if (0 < iVar7) {
        pcVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
        pcVar12 = pcVar11;
        pnVar16 = &this->m_nonbasicValue;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + (ulong)bVar22 * -8 + 4);
        }
        (this->m_nonbasicValue).m_backend.exp = pcVar11->exp;
        (this->m_nonbasicValue).m_backend.neg = pcVar11->neg;
        iVar2 = pcVar11->prec_elem;
        (this->m_nonbasicValue).m_backend.fpclass = pcVar11->fpclass;
        (this->m_nonbasicValue).m_backend.prec_elem = iVar2;
        this->m_nonbasicValueUpToDate = false;
      }
    }
    SVar8 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualRowStatus(&this->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,i);
    pSVar3[i] = SVar8;
    break;
  case P_FIXED:
    pnVar16 = newLhs;
    pnVar19 = &local_230;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (newLhs->m_backend).exp;
    local_230.m_backend.neg = (newLhs->m_backend).neg;
    local_230.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_230.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pcVar12 = &local_4b8;
    pnVar16 = &local_2b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = iVar7;
    local_2b0.m_backend.neg = bVar6;
    local_2b0.m_backend.fpclass = fVar1;
    local_2b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_230,&local_2b0,RVar5);
    if ((bVar6) && (pSVar3[i] = P_ON_UPPER, this->initialized == true)) {
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar18 = (this->theLRbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar17 = pnVar4 + i;
      pnVar20 = pnVar18 + i;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
        pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pnVar18[i].m_backend.exp = pnVar4[i].m_backend.exp;
      pnVar18[i].m_backend.neg = pnVar4[i].m_backend.neg;
      iVar2 = pnVar4[i].m_backend.prec_elem;
      pnVar18[i].m_backend.fpclass = pnVar4[i].m_backend.fpclass;
      pnVar18[i].m_backend.prec_elem = iVar2;
    }
    break;
  default:
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_648.data._M_elems._0_8_ = local_648.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_648,"XCHANG03 This should never happen.","");
    *puVar13 = &PTR__SPxException_0069d438;
    puVar13[1] = puVar13 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar13 + 1),local_648.data._M_elems._0_8_,
               local_648.data._M_elems._0_8_ + local_648.data._M_elems._8_8_);
    *puVar13 = &PTR__SPxException_0069d410;
    __cxa_throw(puVar13,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    ::soplex::infinity::__tls_init();
    local_5c8 = *(double *)(in_FS_OFFSET + -8);
    uStack_5c0 = 0;
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_648,-local_5c8);
    fVar10 = (newLhs->m_backend).fpclass;
    if ((fVar10 != cpp_dec_float_NaN) && (local_648.fpclass != cpp_dec_float_NaN)) {
      iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&newLhs->m_backend,&local_648);
      if (iVar9 < 1) {
        ::soplex::infinity::__tls_init();
        local_648.fpclass = cpp_dec_float_finite;
        local_648.prec_elem = 0x1c;
        local_648.data._M_elems[0] = 0;
        local_648.data._M_elems[1] = 0;
        local_648.data._M_elems[2] = 0;
        local_648.data._M_elems[3] = 0;
        local_648.data._M_elems[4] = 0;
        local_648.data._M_elems[5] = 0;
        local_648.data._M_elems[6] = 0;
        local_648.data._M_elems[7] = 0;
        local_648.data._M_elems[8] = 0;
        local_648.data._M_elems[9] = 0;
        local_648.data._M_elems[10] = 0;
        local_648.data._M_elems[0xb] = 0;
        local_648.data._M_elems[0xc] = 0;
        local_648.data._M_elems[0xd] = 0;
        local_648.data._M_elems[0xe] = 0;
        local_648.data._M_elems[0xf] = 0;
        local_648.data._M_elems[0x10] = 0;
        local_648.data._M_elems[0x11] = 0;
        local_648.data._M_elems[0x12] = 0;
        local_648.data._M_elems[0x13] = 0;
        local_648.data._M_elems[0x14] = 0;
        local_648.data._M_elems[0x15] = 0;
        local_648.data._M_elems[0x16] = 0;
        local_648.data._M_elems[0x17] = 0;
        local_648.data._M_elems[0x18] = 0;
        local_648.data._M_elems[0x19] = 0;
        local_648.data._M_elems._104_5_ = 0;
        local_648.data._M_elems[0x1b]._1_3_ = 0;
        local_648.exp = 0;
        local_648.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_648,local_5c8);
        if ((fVar1 == cpp_dec_float_NaN) || (local_648.fpclass == cpp_dec_float_NaN)) {
LAB_004e0e6f:
          pSVar3[i] = P_ON_UPPER;
          if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
          local_538.fpclass = cpp_dec_float_finite;
          local_538.prec_elem = 0x1c;
          local_538.data._M_elems[0] = 0;
          local_538.data._M_elems[1] = 0;
          local_538.data._M_elems[2] = 0;
          local_538.data._M_elems[3] = 0;
          local_538.data._M_elems[4] = 0;
          local_538.data._M_elems[5] = 0;
          local_538.data._M_elems[6] = 0;
          local_538.data._M_elems[7] = 0;
          local_538.data._M_elems[8] = 0;
          local_538.data._M_elems[9] = 0;
          local_538.data._M_elems[10] = 0;
          local_538.data._M_elems[0xb] = 0;
          local_538.data._M_elems[0xc] = 0;
          local_538.data._M_elems[0xd] = 0;
          local_538.data._M_elems[0xe] = 0;
          local_538.data._M_elems[0xf] = 0;
          local_538.data._M_elems[0x10] = 0;
          local_538.data._M_elems[0x11] = 0;
          local_538.data._M_elems[0x12] = 0;
          local_538.data._M_elems[0x13] = 0;
          local_538.data._M_elems[0x14] = 0;
          local_538.data._M_elems[0x15] = 0;
          local_538.data._M_elems[0x16] = 0;
          local_538.data._M_elems[0x17] = 0;
          local_538.data._M_elems[0x18] = 0;
          local_538.data._M_elems[0x19] = 0;
          local_538.data._M_elems._104_5_ = 0;
          local_538.data._M_elems[0x1b]._1_3_ = 0;
          local_538.exp = 0;
          local_538.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_538,
                     &(this->theLRbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_4b8);
          local_3b8.fpclass = cpp_dec_float_finite;
          local_3b8.prec_elem = 0x1c;
          local_3b8.data._M_elems[0] = 0;
          local_3b8.data._M_elems[1] = 0;
          local_3b8.data._M_elems[2] = 0;
          local_3b8.data._M_elems[3] = 0;
          local_3b8.data._M_elems[4] = 0;
          local_3b8.data._M_elems[5] = 0;
          local_3b8.data._M_elems[6] = 0;
          local_3b8.data._M_elems[7] = 0;
          local_3b8.data._M_elems[8] = 0;
          local_3b8.data._M_elems[9] = 0;
          local_3b8.data._M_elems[10] = 0;
          local_3b8.data._M_elems[0xb] = 0;
          local_3b8.data._M_elems[0xc] = 0;
          local_3b8.data._M_elems[0xd] = 0;
          local_3b8.data._M_elems[0xe] = 0;
          local_3b8.data._M_elems[0xf] = 0;
          local_3b8.data._M_elems[0x10] = 0;
          local_3b8.data._M_elems[0x11] = 0;
          local_3b8.data._M_elems[0x12] = 0;
          local_3b8.data._M_elems[0x13] = 0;
          local_3b8.data._M_elems[0x14] = 0;
          local_3b8.data._M_elems[0x15] = 0;
          local_3b8.data._M_elems[0x16] = 0;
          local_3b8.data._M_elems[0x17] = 0;
          local_3b8.data._M_elems[0x18] = 0;
          local_3b8.data._M_elems[0x19] = 0;
          local_3b8.data._M_elems._104_5_ = 0;
          local_3b8.data._M_elems[0x1b]._1_3_ = 0;
          local_3b8.exp = 0;
          local_3b8.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_3b8,
                     &(this->theURbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldLhs->m_backend);
          local_648.fpclass = cpp_dec_float_finite;
          local_648.prec_elem = 0x1c;
          local_648.data._M_elems[0] = 0;
          local_648.data._M_elems[1] = 0;
          local_648.data._M_elems[2] = 0;
          local_648.data._M_elems[3] = 0;
          local_648.data._M_elems[4] = 0;
          local_648.data._M_elems[5] = 0;
          local_648.data._M_elems[6] = 0;
          local_648.data._M_elems[7] = 0;
          local_648.data._M_elems[8] = 0;
          local_648.data._M_elems[9] = 0;
          local_648.data._M_elems[10] = 0;
          local_648.data._M_elems[0xb] = 0;
          local_648.data._M_elems[0xc] = 0;
          local_648.data._M_elems[0xd] = 0;
          local_648.data._M_elems[0xe] = 0;
          local_648.data._M_elems[0xf] = 0;
          local_648.data._M_elems[0x10] = 0;
          local_648.data._M_elems[0x11] = 0;
          local_648.data._M_elems[0x12] = 0;
          local_648.data._M_elems[0x13] = 0;
          local_648.data._M_elems[0x14] = 0;
          local_648.data._M_elems[0x15] = 0;
          local_648.data._M_elems[0x16] = 0;
          local_648.data._M_elems[0x17] = 0;
          local_648.data._M_elems[0x18] = 0;
          local_648.data._M_elems[0x19] = 0;
          local_648.data._M_elems._104_5_ = 0;
          local_648.data._M_elems[0x1b]._1_3_ = 0;
          local_648.exp = 0;
          local_648.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_648,&local_538,&local_3b8);
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_4b8,&local_648);
          if (iVar7 < 0) goto LAB_004e0e6f;
          pSVar3[i] = P_FREE;
          if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
          pnVar4 = (this->theURbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = pnVar4 + i;
          pcVar12 = &local_538;
          for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
            (pcVar12->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          }
          iVar7 = pnVar4[i].m_backend.exp;
          local_538.exp = iVar7;
          bVar21 = pnVar4[i].m_backend.neg;
          local_538.neg = (bool)bVar21;
          fVar1 = pnVar4[i].m_backend.fpclass;
          iVar2 = pnVar4[i].m_backend.prec_elem;
          local_538.prec_elem = iVar2;
          local_538.fpclass = fVar1;
          if (local_538.data._M_elems[0] != 0 || fVar1 != cpp_dec_float_finite) {
            bVar21 = bVar21 ^ 1;
            local_538.neg = (bool)bVar21;
          }
          local_648.fpclass = cpp_dec_float_finite;
          local_648.prec_elem = 0x1c;
          local_648.data._M_elems[0] = 0;
          local_648.data._M_elems[1] = 0;
          local_648.data._M_elems[2] = 0;
          local_648.data._M_elems[3] = 0;
          local_648.data._M_elems[4] = 0;
          local_648.data._M_elems[5] = 0;
          local_648.data._M_elems[6] = 0;
          local_648.data._M_elems[7] = 0;
          local_648.data._M_elems[8] = 0;
          local_648.data._M_elems[9] = 0;
          local_648.data._M_elems[10] = 0;
          local_648.data._M_elems[0xb] = 0;
          local_648.data._M_elems[0xc] = 0;
          local_648.data._M_elems[0xd] = 0;
          local_648.data._M_elems[0xe] = 0;
          local_648.data._M_elems[0xf] = 0;
          local_648.data._M_elems[0x10] = 0;
          local_648.data._M_elems[0x11] = 0;
          local_648.data._M_elems[0x12] = 0;
          local_648.data._M_elems[0x13] = 0;
          local_648.data._M_elems[0x14] = 0;
          local_648.data._M_elems[0x15] = 0;
          local_648.data._M_elems[0x16] = 0;
          local_648.data._M_elems[0x17] = 0;
          local_648.data._M_elems[0x18] = 0;
          local_648.data._M_elems[0x19] = 0;
          local_648.data._M_elems._104_5_ = 0;
          local_648.data._M_elems[0x1b]._1_3_ = 0;
          local_648.exp = 0;
          local_648.neg = false;
          pcVar12 = &local_538;
          local_538.neg = (bool)bVar21;
          if (&local_648 != &oldLhs->m_backend) {
            pcVar12 = &local_538;
            pcVar11 = &local_648;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pcVar11->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar22 * -8 + 4);
            }
            local_648.prec_elem = iVar2;
            local_648.fpclass = fVar1;
            pcVar12 = &oldLhs->m_backend;
            local_648.exp = iVar7;
            local_648.neg = (bool)bVar21;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_648,pcVar12);
        }
        pcVar12 = &local_648;
        puVar15 = (uint *)&local_5b8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar15 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
        }
        iStack_548 = local_648.exp;
        bStack_544 = local_648.neg;
        goto LAB_004e0cc5;
      }
      fVar10 = (newLhs->m_backend).fpclass;
    }
    pnVar16 = newLhs;
    pnVar19 = &local_438;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_438.m_backend.exp = (newLhs->m_backend).exp;
    local_438.m_backend.neg = (newLhs->m_backend).neg;
    local_438.m_backend.fpclass = fVar10;
    local_438.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pcVar12 = &local_4b8;
    pnVar16 = &local_b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = iVar7;
    local_b0.m_backend.neg = bVar6;
    local_b0.m_backend.fpclass = fVar1;
    local_b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_438,&local_b0,RVar5);
    if (bVar6) {
      pSVar3[i] = P_FIXED;
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .object.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      pnVar4 = (this->theURbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    local_538.fpclass = cpp_dec_float_finite;
    local_538.prec_elem = 0x1c;
    local_538.data._M_elems[0] = 0;
    local_538.data._M_elems[1] = 0;
    local_538.data._M_elems[2] = 0;
    local_538.data._M_elems[3] = 0;
    local_538.data._M_elems[4] = 0;
    local_538.data._M_elems[5] = 0;
    local_538.data._M_elems[6] = 0;
    local_538.data._M_elems[7] = 0;
    local_538.data._M_elems[8] = 0;
    local_538.data._M_elems[9] = 0;
    local_538.data._M_elems[10] = 0;
    local_538.data._M_elems[0xb] = 0;
    local_538.data._M_elems[0xc] = 0;
    local_538.data._M_elems[0xd] = 0;
    local_538.data._M_elems[0xe] = 0;
    local_538.data._M_elems[0xf] = 0;
    local_538.data._M_elems[0x10] = 0;
    local_538.data._M_elems[0x11] = 0;
    local_538.data._M_elems[0x12] = 0;
    local_538.data._M_elems[0x13] = 0;
    local_538.data._M_elems[0x14] = 0;
    local_538.data._M_elems[0x15] = 0;
    local_538.data._M_elems[0x16] = 0;
    local_538.data._M_elems[0x17] = 0;
    local_538.data._M_elems[0x18] = 0;
    local_538.data._M_elems[0x19] = 0;
    local_538.data._M_elems._104_5_ = 0;
    local_538.data._M_elems[0x1b]._1_3_ = 0;
    local_538.exp = 0;
    local_538.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_538,&newLhs->m_backend,&oldLhs->m_backend);
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_648,&pnVar4[i].m_backend,&local_538);
    pcVar12 = &local_648;
    puVar15 = (uint *)&local_5b8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar15 = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    iStack_548 = local_648.exp;
    bStack_544 = local_648.neg;
    goto LAB_004e0cc5;
  case P_ON_UPPER:
    pnVar16 = newLhs;
    pnVar19 = &local_130;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (newLhs->m_backend).exp;
    local_130.m_backend.neg = (newLhs->m_backend).neg;
    local_130.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_130.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pcVar12 = &local_4b8;
    pnVar16 = &local_1b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = iVar7;
    local_1b0.m_backend.neg = bVar6;
    local_1b0.m_backend.fpclass = fVar1;
    local_1b0.m_backend.prec_elem = iVar2;
    RVar5 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar6 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,&local_1b0,RVar5);
    if (bVar6) {
      pSVar3[i] = P_FIXED;
    }
    break;
  case P_FREE:
    ::soplex::infinity::__tls_init();
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_648,-*(double *)(in_FS_OFFSET + -8));
    if (((((newLhs->m_backend).fpclass == cpp_dec_float_NaN) ||
         (local_648.fpclass == cpp_dec_float_NaN)) ||
        (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&newLhs->m_backend,&local_648), iVar7 < 1)) ||
       ((pSVar3[i] = P_ON_LOWER, this->m_nonbasicValueUpToDate != true || (this->theRep != COLUMN)))
       ) break;
    local_648.fpclass = cpp_dec_float_finite;
    local_648.prec_elem = 0x1c;
    local_648.data._M_elems[0] = 0;
    local_648.data._M_elems[1] = 0;
    local_648.data._M_elems[2] = 0;
    local_648.data._M_elems[3] = 0;
    local_648.data._M_elems[4] = 0;
    local_648.data._M_elems[5] = 0;
    local_648.data._M_elems[6] = 0;
    local_648.data._M_elems[7] = 0;
    local_648.data._M_elems[8] = 0;
    local_648.data._M_elems[9] = 0;
    local_648.data._M_elems[10] = 0;
    local_648.data._M_elems[0xb] = 0;
    local_648.data._M_elems[0xc] = 0;
    local_648.data._M_elems[0xd] = 0;
    local_648.data._M_elems[0xe] = 0;
    local_648.data._M_elems[0xf] = 0;
    local_648.data._M_elems[0x10] = 0;
    local_648.data._M_elems[0x11] = 0;
    local_648.data._M_elems[0x12] = 0;
    local_648.data._M_elems[0x13] = 0;
    local_648.data._M_elems[0x14] = 0;
    local_648.data._M_elems[0x15] = 0;
    local_648.data._M_elems[0x16] = 0;
    local_648.data._M_elems[0x17] = 0;
    local_648.data._M_elems[0x18] = 0;
    local_648.data._M_elems[0x19] = 0;
    local_648.data._M_elems._104_5_ = 0;
    local_648.data._M_elems[0x1b]._1_3_ = 0;
    local_648.exp = 0;
    local_648.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_648,
               &(this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newLhs->m_backend);
    pcVar12 = &local_648;
    puVar15 = (uint *)&local_5b8;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar15 = (pcVar12->data)._M_elems[0];
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar22 * -8 + 4);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    }
    iStack_548 = local_648.exp;
    bStack_544 = local_648.neg;
LAB_004e0cc5:
    local_540._0_4_ = local_648.fpclass;
    local_540._4_4_ = local_648.prec_elem;
    local_648.exp = iStack_548;
    local_648.neg = (bool)bStack_544;
  }
  if (this->theRep == COLUMN) {
    puVar15 = (uint *)&local_5b8;
    pnVar16 = &local_330;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = iStack_548;
    local_330.m_backend.neg = (bool)bStack_544;
    local_330.m_backend.fpclass = (fpclass_type)local_540;
    local_330.m_backend.prec_elem = local_540._4_4_;
    updateNonbasicValue(this,&local_330);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhsStatus(int i, R newLhs, R oldLhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currRhs   = this->rhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG03 changeLhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLhs <= R(-infinity))
      {
         if(currRhs >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theURbound[i] * oldLhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLRbound[i] * currRhs) - (theURbound[i] * oldLhs);
         }
      }
      else if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newLhs - oldLhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theURbound[i] * (newLhs - oldLhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLhs > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theURbound[i] * newLhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theLRbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG03 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}